

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_reaper.cc
# Opt level: O1

bool __thiscall
sptk::PitchExtractionByReaper::Get
          (PitchExtractionByReaper *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  Polarity PVar10;
  int16_t *piVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int tmp;
  vector<float,_std::allocator<float>_> correlation;
  vector<short,_std::allocator<short>_> integer_waveform;
  EpochTracker epoch_tracker;
  string local_278;
  vector<float,_std::allocator<float>_> local_258;
  vector<short,_std::allocator<short>_> local_240;
  EpochTracker local_228;
  
  if ((this->is_valid_ != true) ||
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    return false;
  }
  reaper::EpochTracker::EpochTracker(&local_228);
  local_228.unvoiced_cost_ = (float)this->voicing_threshold_;
  std::vector<short,_std::allocator<short>_>::vector
            (&local_240,
             (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_278);
  pdVar1 = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  piVar11 = local_240.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (pdVar8 = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
    *piVar11 = (int16_t)(int)*pdVar8;
    piVar11 = piVar11 + 1;
  }
  bVar6 = reaper::EpochTracker::Init
                    (&local_228,
                     local_240.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (int32_t)((ulong)((long)local_240.
                                             super__Vector_base<short,_std::allocator<short>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_240.
                                            super__Vector_base<short,_std::allocator<short>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 1),
                     (float)this->sampling_rate_,(float)this->lower_f0_,(float)this->upper_f0_,true,
                     false);
  if (bVar6) {
    if (polarity != (Polarity *)0x0) {
      bVar6 = reaper::EpochTracker::ComputePolarity(&local_228,(int *)&local_278);
      if (!bVar6) goto LAB_001089c6;
      PVar10 = (uint)((int)local_278._M_dataplus._M_p == -1) * 2;
      if ((int)local_278._M_dataplus._M_p == 1) {
        PVar10 = kPositive;
      }
      *polarity = PVar10;
    }
    if (f0 == (vector<double,_std::allocator<double>_> *)0x0 &&
        epochs == (vector<double,_std::allocator<double>_> *)0x0) {
LAB_00108938:
      if (f0 == (vector<double,_std::allocator<double>_> *)0x0) {
        if (epochs != (vector<double,_std::allocator<double>_> *)0x0) goto LAB_00108b7a;
      }
      else {
        local_278.field_2._M_allocated_capacity = 0;
        local_278._M_dataplus._M_p = (pointer)0x0;
        local_278._M_string_length = 0;
        local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        bVar6 = reaper::EpochTracker::ResampleAndReturnResults
                          (&local_228,(float)this->frame_shift_ / (float)this->sampling_rate_,
                           (vector<float,_std::allocator<float>_> *)&local_278,&local_258);
        if (!bVar6) {
          if (local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_278._M_dataplus._M_p);
          }
          goto LAB_001089c6;
        }
        fVar18 = ceilf((float)(ulong)((long)(waveform->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)(waveform->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data._M_start >> 3) /
                       (float)this->frame_shift_);
        iVar7 = (int)fVar18;
        if (iVar7 < (int)(local_278._M_string_length - (long)local_278._M_dataplus._M_p >> 2)) {
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)&local_278,(long)iVar7);
        }
        std::vector<double,_std::allocator<double>_>::resize(f0,(long)iVar7);
        pdVar2 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = (long)(local_278._M_string_length - (long)local_278._M_dataplus._M_p) >> 2;
        if (0 < lVar12) {
          lVar15 = lVar12 + 1;
          lVar16 = 0;
          do {
            *(double *)((long)pdVar2 + lVar16 * 2) =
                 (double)*(float *)(local_278._M_dataplus._M_p + lVar16);
            lVar15 = lVar15 + -1;
            lVar16 = lVar16 + 4;
          } while (1 < lVar15);
        }
        auVar5 = _DAT_0012bcc0;
        auVar4 = _DAT_0012bcb0;
        pdVar3 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar2 + lVar12 != pdVar3) {
          fVar18 = *(float *)(local_278._M_string_length - 4);
          uVar9 = (long)pdVar3 +
                  (-8 - ((long)pdVar2 +
                        (local_278._M_string_length - (long)local_278._M_dataplus._M_p) * 2));
          auVar21._8_4_ = (int)uVar9;
          auVar21._0_8_ = uVar9;
          auVar21._12_4_ = (int)(uVar9 >> 0x20);
          auVar19._0_8_ = uVar9 >> 3;
          auVar19._8_8_ = auVar21._8_8_ >> 3;
          uVar13 = 0;
          auVar19 = auVar19 ^ _DAT_0012bcc0;
          do {
            auVar20._8_4_ = (int)uVar13;
            auVar20._0_8_ = uVar13;
            auVar20._12_4_ = (int)(uVar13 >> 0x20);
            auVar21 = (auVar20 | auVar4) ^ auVar5;
            if ((bool)(~(auVar21._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar21._0_4_ ||
                        auVar19._4_4_ < auVar21._4_4_) & 1)) {
              pdVar2[lVar12 + uVar13] = (double)fVar18;
            }
            if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
                auVar21._12_4_ <= auVar19._12_4_) {
              pdVar2[lVar12 + uVar13 + 1] = (double)fVar18;
            }
            uVar13 = uVar13 + 2;
          } while (((uVar9 >> 3) + 2 & 0xfffffffffffffffe) != uVar13);
        }
        if (local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        if (epochs == (vector<double,_std::allocator<double>_> *)0x0 || !bVar6) goto LAB_001089c8;
LAB_00108b7a:
        local_278._M_dataplus._M_p = (pointer)0x0;
        local_278._M_string_length = 0;
        local_278.field_2._M_allocated_capacity = 0;
        local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        reaper::EpochTracker::GetFilledEpochs
                  (&local_228,0.01,(vector<float,_std::allocator<float>_> *)&local_278,
                   (vector<short,_std::allocator<short>_> *)&local_258);
        uVar9 = 0;
        uVar17 = (uint)(local_278._M_string_length - (long)local_278._M_dataplus._M_p >> 2);
        if (0 < (int)uVar17) {
          uVar13 = 0;
          do {
            uVar14 = ((int)uVar9 + 1) -
                     (uint)(*(short *)((long)local_258.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start + uVar13 * 2)
                           == 0);
            uVar9 = (ulong)uVar14;
            uVar13 = uVar13 + 1;
          } while ((uVar17 & 0x7fffffff) != uVar13);
          uVar9 = (ulong)uVar14;
        }
        std::vector<double,_std::allocator<double>_>::resize(epochs,uVar9);
        if (0 < (int)uVar17) {
          pdVar2 = (epochs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar9 = 0;
          iVar7 = 0;
          do {
            if (*(short *)((long)local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start + uVar9 * 2) != 0) {
              lVar12 = (long)iVar7;
              iVar7 = iVar7 + 1;
              pdVar2[lVar12] = (double)*(float *)(local_278._M_dataplus._M_p + uVar9 * 4);
            }
            uVar9 = uVar9 + 1;
          } while ((uVar17 & 0x7fffffff) != uVar9);
        }
        if (local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_278._M_dataplus._M_p);
        }
      }
      bVar6 = true;
      goto LAB_001089c8;
    }
    bVar6 = reaper::EpochTracker::ComputeFeatures(&local_228);
    if (bVar6) {
      bVar6 = reaper::EpochTracker::TrackEpochs(&local_228);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
      reaper::EpochTracker::WriteDiagnostics(&local_228,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if (bVar6) goto LAB_00108938;
    }
  }
LAB_001089c6:
  bVar6 = false;
LAB_001089c8:
  if (local_240.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (int16_t *)0x0) {
    operator_delete(local_240.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  reaper::EpochTracker::~EpochTracker(&local_228);
  return bVar6;
}

Assistant:

bool PitchExtractionByReaper::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  reaper::EpochTracker epoch_tracker;
  epoch_tracker.set_unvoiced_cost(static_cast<float>(voicing_threshold_));
  std::vector<int16_t> integer_waveform(waveform.size());
  std::transform(waveform.begin(), waveform.end(), integer_waveform.begin(),
                 [](double x) { return static_cast<int16_t>(x); });
  if (!epoch_tracker.Init(integer_waveform.data(),
                          static_cast<int32_t>(integer_waveform.size()),
                          static_cast<float>(sampling_rate_),
                          static_cast<float>(lower_f0_),
                          static_cast<float>(upper_f0_), true, false)) {
    return false;
  }

  if (NULL != polarity) {
    // ComputePolarity should be run before calling ComputeFeatures.
    int tmp;
    if (!epoch_tracker.ComputePolarity(&tmp)) {
      return false;
    }
    if (1 == tmp) {
      *polarity = PitchExtractionInterface::Polarity::kPositive;
    } else if (-1 == tmp) {
      *polarity = PitchExtractionInterface::Polarity::kNegative;
    } else {
      *polarity = PitchExtractionInterface::Polarity::kUnknown;
    }
  }

  if (NULL != f0 || NULL != epochs) {
    if (!epoch_tracker.ComputeFeatures()) {
      return false;
    }
    const bool track_result(epoch_tracker.TrackEpochs());
    epoch_tracker.WriteDiagnostics("");
    if (!track_result) {
      return false;
    }
  }

  if (NULL != f0) {
    const float external_frame_interval(static_cast<float>(frame_shift_) /
                                        static_cast<float>(sampling_rate_));
    std::vector<float> tmp_f0;
    std::vector<float> correlation;
    if (!epoch_tracker.ResampleAndReturnResults(external_frame_interval,
                                                &tmp_f0, &correlation)) {
      return false;
    }
    const int target_length(static_cast<int>(
        std::ceil(static_cast<float>(waveform.size()) / frame_shift_)));
    if (target_length < static_cast<int>(tmp_f0.size())) {
      tmp_f0.resize(target_length);
    }
    f0->resize(target_length);
    std::copy(tmp_f0.begin(), tmp_f0.end(), f0->begin());
    std::fill(f0->begin() + tmp_f0.size(), f0->end(), tmp_f0.back());
  }

  if (NULL != epochs) {
    std::vector<float> times;
    std::vector<int16_t> voicing;
    epoch_tracker.GetFilledEpochs(reaper::kUnvoicedPulseInterval, &times,
                                  &voicing);

    const int time_length(static_cast<int>(times.size()));
    int num_epochs(0);
    for (int i(0); i < time_length; ++i) {
      if (voicing[i]) ++num_epochs;
    }
    epochs->resize(num_epochs);
    double* output(&((*epochs)[0]));
    for (int i(0), j(0); i < time_length; ++i) {
      if (voicing[i]) output[j++] = times[i];
    }
  }

  return true;
}